

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_prepared_api.cpp
# Opt level: O3

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
TestExecutePrepared(Connection *con,string *query)

{
  undefined1 uVar1;
  __uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_> _Var2;
  tuple<duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_> extraout_RAX;
  AssertionHandler catchAssertionHandler;
  _Head_base<0UL,_duckdb::PreparedStatement_*,_false> local_a0;
  StringRef local_98;
  AssertionHandler local_88;
  StringRef local_40;
  SourceLineInfo local_30;
  
  duckdb::Connection::Prepare((string *)&local_a0);
  local_98.m_start = "REQUIRE";
  local_98.m_size = 7;
  local_30.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_prepared_api.cpp"
  ;
  local_30.line = 0x196;
  Catch::StringRef::StringRef(&local_40,"!prepared->HasError()");
  Catch::AssertionHandler::AssertionHandler(&local_88,&local_98,&local_30,local_40,Normal);
  duckdb::
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
  operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
              *)&local_a0);
  uVar1 = duckdb::PreparedStatement::HasError();
  local_98.m_start = (char *)(CONCAT71(local_98.m_start._1_7_,uVar1) ^ 1);
  Catch::AssertionHandler::handleExpr<bool>(&local_88,(ExprLhs<bool> *)&local_98);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  duckdb::
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
  operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
              *)&local_a0);
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
  super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl =
       (tuple<duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>)
       duckdb::PreparedStatement::Execute<>((PreparedStatement *)con);
  if (local_a0._M_head_impl != (PreparedStatement *)0x0) {
    duckdb::PreparedStatement::~PreparedStatement(local_a0._M_head_impl);
    operator_delete(local_a0._M_head_impl);
    _Var2._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
    super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl =
         (tuple<duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>)
         (tuple<duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>)
         extraout_RAX.
         super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
         super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
  }
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>)
         _Var2._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
         super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
}

Assistant:

static duckdb::unique_ptr<QueryResult> TestExecutePrepared(Connection &con, string query) {
	auto prepared = con.Prepare(query);
	REQUIRE(!prepared->HasError());
	return prepared->Execute();
}